

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPathIdentifier(AsciiParser *this,string *path_identifier)

{
  int *piVar1;
  uint8_t uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  StreamReader *pSVar6;
  string s;
  string WHITESPACE;
  stringstream ss;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  long *local_210 [2];
  long local_200 [2];
  undefined4 *local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined2 uStack_1dc;
  undefined1 uStack_1da;
  undefined1 uStack_1d9;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar3 = Expect(this,'<');
  if (bVar3) {
    bVar3 = SkipWhitespace(this);
    if (bVar3) {
      pSVar6 = this->_sr;
      uVar4 = pSVar6->idx_;
      if (uVar4 < pSVar6->length_) {
        do {
          uVar2 = pSVar6->binary_[uVar4];
          if (uVar2 == '\0') break;
          pSVar6->idx_ = uVar4 + 1;
          if (uVar2 == '>') {
            piVar1 = &(this->_curr_cursor).col;
            *piVar1 = *piVar1 + 1;
            ::std::__cxx11::stringbuf::str();
            local_1e0 = 0x90d0a20;
            uStack_1dc = 0xb0c;
            local_1e8 = 6;
            uStack_1da = 0;
            local_210[0] = local_200;
            local_1f0 = &local_1e0;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_210,local_1d0,local_1c8 + (long)local_1d0);
            lVar5 = ::std::__cxx11::string::find_first_not_of((char *)local_210,(ulong)local_1f0,0);
            if (lVar5 == -1) {
              local_228 = 0;
              local_220 = 0;
              local_230 = &local_220;
            }
            else {
              ::std::__cxx11::string::substr((ulong)&local_230,(ulong)local_210);
            }
            ::std::__cxx11::string::operator=((string *)local_210,(string *)&local_230);
            if (local_230 != &local_220) {
              operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
            }
            lVar5 = ::std::__cxx11::string::find_last_not_of
                              ((char *)local_210,(ulong)local_1f0,0xffffffffffffffff);
            if (lVar5 == -1) {
              local_228 = 0;
              local_220 = 0;
              local_230 = &local_220;
            }
            else {
              ::std::__cxx11::string::substr((ulong)&local_230,(ulong)local_210);
            }
            ::std::__cxx11::string::operator=((string *)local_210,(string *)&local_230);
            if (local_230 != &local_220) {
              operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
            }
            if (local_1f0 != &local_1e0) {
              operator_delete(local_1f0,
                              CONCAT17(uStack_1d9,
                                       CONCAT16(uStack_1da,CONCAT24(uStack_1dc,local_1e0))) + 1);
            }
            ::std::__cxx11::string::operator=((string *)path_identifier,(string *)local_210);
            if (local_210[0] != local_200) {
              operator_delete(local_210[0],local_200[0] + 1);
            }
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            bVar3 = true;
            goto LAB_0035ce96;
          }
          local_1f0 = (undefined4 *)CONCAT71(local_1f0._1_7_,uVar2);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)&local_1f0,1);
          pSVar6 = this->_sr;
          uVar4 = pSVar6->idx_;
        } while (uVar4 < pSVar6->length_);
      }
    }
  }
  bVar3 = false;
LAB_0035ce96:
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return bVar3;
}

Assistant:

bool AsciiParser::ReadPathIdentifier(std::string *path_identifier) {
  // path_identifier = `<` string `>`
  std::stringstream ss;

  if (!Expect('<')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  // read until '>'
  bool ok = false;
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '>') {
      // end
      ok = true;
      _curr_cursor.col++;
      break;
    }

    // TODO: Check if character is valid for path identifier
    ss << c;
  }

  if (!ok) {
    return false;
  }

  (*path_identifier) = TrimString(ss.str());
  // std::cout << "PathIdentifier: " << (*path_identifier) << "\n";

  return true;
}